

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

void amqp_device_do_work(AMQP_DEVICE_HANDLE handle)

{
  AUTHENTICATION_STATE AVar1;
  bool bVar2;
  int iVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  DEVICE_STATE DVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 uVar7;
  tickcounter_ms_t current_time_ms;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  if (handle == (AMQP_DEVICE_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
               ,"amqp_device_do_work",0x3aa,1,
               "Failed to perform amqp_device_do_work (handle is NULL)");
    return;
  }
  DVar4 = handle->state;
  if (DVar4 == DEVICE_STATE_STARTED) {
    if ((handle->config->authentication_mode != DEVICE_AUTH_MODE_CBS) ||
       (handle->auth_state == AUTHENTICATION_STATE_STARTED)) {
      if (handle->msgr_state != TELEMETRY_MESSENGER_STATE_STARTED) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                     ,"amqp_device_do_work",0x45a,1,
                     "Device \'%s\' is started but messenger reported unexpected state %d",
                     handle->config->device_id,CONCAT44(uVar7,handle->msgr_state));
        }
        update_state(handle,DEVICE_STATE_ERROR_MSG);
      }
      if (handle->twin_msgr_state == TWIN_MESSENGER_STATE_STARTED) goto switchD_00130819_caseD_2;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar6 = handle->config->device_id;
        pcVar5 = "Device \'%s\' is started but TWIN messenger reported unexpected state %d";
        iVar3 = 0x460;
        goto LAB_00130908;
      }
      goto LAB_0013090d;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                 ,"amqp_device_do_work",0x444,1,
                 "Device \'%s\' is started but authentication reported unexpected state %d",
                 handle->config->device_id,CONCAT44(uVar7,handle->auth_state));
    }
    if ((handle->auth_state == AUTHENTICATION_STATE_ERROR) ||
       (handle->auth_error_code == AUTHENTICATION_ERROR_AUTH_FAILED)) {
      DVar4 = DEVICE_STATE_ERROR_AUTH;
    }
    else {
      DVar4 = DEVICE_STATE_ERROR_AUTH_TIMEOUT;
    }
    goto LAB_0013090f;
  }
  if (DVar4 != DEVICE_STATE_STARTING) {
    if (DVar4 != DEVICE_STATE_STOPPING) goto switchD_00130819_caseD_2;
    iVar3 = tickcounter_get_current_ms(handle->tick_counter_handle,&current_time_ms);
    if (iVar3 != 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0013090d;
      pcVar6 = handle->config->device_id;
      pcVar5 = "Failed stopping device \'%s\' (could not get tickcounter time)";
      iVar3 = 0x3b7;
      goto LAB_00130908;
    }
    if ((CONCAT44(current_time_ms._4_4_,(int)current_time_ms) - handle->last_stop_request_time <=
         handle->stop_delay_ms) || (iVar3 = internal_device_stop(handle), iVar3 == 0))
    goto switchD_00130819_caseD_2;
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar6 = handle->config->device_id;
      pcVar5 = "Failed stopping device \'%s\'";
      iVar3 = 0x3be;
      goto LAB_00130908;
    }
    goto LAB_0013090d;
  }
  if (handle->config->authentication_mode == DEVICE_AUTH_MODE_CBS) {
    AVar1 = handle->auth_state;
    if (AVar1 == AUTHENTICATION_STATE_ERROR) {
      if (handle->auth_error_code != AUTHENTICATION_ERROR_AUTH_FAILED) {
        DVar4 = DEVICE_STATE_ERROR_AUTH_TIMEOUT;
        goto LAB_001306d2;
      }
LAB_0013066b:
      DVar4 = DEVICE_STATE_ERROR_AUTH;
    }
    else {
      if (AVar1 != AUTHENTICATION_STATE_STARTING) {
        if ((AVar1 != AUTHENTICATION_STATE_STOPPED) ||
           (iVar3 = authentication_start(handle->authentication_handle,handle->cbs_handle),
           iVar3 == 0)) goto LAB_001306d7;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                     ,"amqp_device_do_work",0x3cb,1,
                     "Device \'%s\' failed to be authenticated (authentication_start failed)",
                     handle->config->device_id);
        }
        goto LAB_0013066b;
      }
      iVar3 = is_timeout_reached(handle->auth_state_last_changed_time,
                                 handle->auth_state_change_timeout_secs,(int *)&current_time_ms);
      if (iVar3 == 0) {
        if ((int)current_time_ms != 1) goto LAB_001306d7;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        DVar4 = DEVICE_STATE_ERROR_AUTH_TIMEOUT;
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar6 = handle->config->device_id;
          pcVar5 = 
          "Device \'%s\' authentication did not complete starting within expected timeout (%lu)";
          iVar3 = 0x3da;
          goto LAB_001306c8;
        }
      }
      else {
        DVar4 = DEVICE_STATE_ERROR_AUTH;
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar6 = handle->config->device_id;
          pcVar5 = 
          "Device \'%s\' failed verifying the timeout for authentication start (is_timeout_reached failed)"
          ;
          iVar3 = 0x3d5;
LAB_001306c8:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                     ,"amqp_device_do_work",iVar3,1,pcVar5,pcVar6);
        }
      }
    }
LAB_001306d2:
    update_state(handle,DVar4);
  }
LAB_001306d7:
  if ((handle->config->authentication_mode != DEVICE_AUTH_MODE_X509) &&
     (handle->auth_state != AUTHENTICATION_STATE_STARTED)) goto switchD_00130819_caseD_2;
  bVar2 = false;
  switch(handle->msgr_state) {
  case TELEMETRY_MESSENGER_STATE_STARTING:
    iVar3 = is_timeout_reached(handle->msgr_state_last_changed_time,
                               handle->msgr_state_change_timeout_secs,(int *)&current_time_ms);
    if (iVar3 == 0) {
      if ((int)current_time_ms != 1) goto LAB_001307fc;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar6 = handle->config->device_id;
        pcVar5 = "Device \'%s\' messenger did not complete starting within expected timeout (%lu)";
        iVar3 = 0x405;
        goto LAB_001307ec;
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar6 = handle->config->device_id;
        pcVar5 = 
        "Device \'%s\' failed verifying the timeout for messenger start (is_timeout_reached failed)"
        ;
        iVar3 = 0x3ff;
        goto LAB_001307ec;
      }
    }
    goto LAB_001307f1;
  case TELEMETRY_MESSENGER_STATE_STARTED:
    bVar2 = true;
    break;
  case TELEMETRY_MESSENGER_STATE_STOPPED:
    iVar3 = telemetry_messenger_start(handle->messenger_handle,handle->session_handle);
    if (iVar3 != 0) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar6 = handle->config->device_id;
        pcVar5 = "Device \'%s\' messenger failed to be started (messenger_start failed)";
        iVar3 = 0x3f5;
        goto LAB_001307ec;
      }
      goto LAB_001307f1;
    }
    goto LAB_001307fc;
  case TELEMETRY_MESSENGER_STATE_ERROR:
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar6 = handle->config->device_id;
      pcVar5 = "Device \'%s\' messenger failed to be started (messenger got into error state)";
      iVar3 = 0x40c;
LAB_001307ec:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                 ,"amqp_device_do_work",iVar3,1,pcVar5,pcVar6);
    }
LAB_001307f1:
    update_state(handle,DEVICE_STATE_ERROR_MSG);
LAB_001307fc:
    bVar2 = false;
  }
  switch(handle->twin_msgr_state) {
  case TWIN_MESSENGER_STATE_STARTING:
    iVar3 = is_timeout_reached(handle->twin_msgr_state_last_changed_time,
                               handle->twin_msgr_state_change_timeout_secs,(int *)&current_time_ms);
    if (iVar3 == 0) {
      if ((int)current_time_ms != 1) goto switchD_00130819_caseD_2;
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar6 = handle->config->device_id;
        pcVar5 = 
        "Device \'%s\' twin messenger did not complete starting within expected timeout (%lu)";
        iVar3 = 0x429;
        goto LAB_00130908;
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        pcVar6 = handle->config->device_id;
        pcVar5 = 
        "Device \'%s\' failed verifying the timeout for twin messenger start (is_timeout_reached failed)"
        ;
        iVar3 = 0x423;
        goto LAB_00130908;
      }
    }
    break;
  case TWIN_MESSENGER_STATE_STARTED:
    if (!bVar2) goto switchD_00130819_caseD_2;
    DVar4 = DEVICE_STATE_STARTED;
    goto LAB_0013090f;
  default:
    goto switchD_00130819_caseD_2;
  case TWIN_MESSENGER_STATE_STOPPED:
    iVar3 = twin_messenger_start(handle->twin_messenger_handle,handle->session_handle);
    if (iVar3 == 0) goto switchD_00130819_caseD_2;
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar6 = handle->config->device_id;
      pcVar5 = "Device \'%s\' twin messenger failed to be started (messenger_start failed)";
      iVar3 = 0x419;
      goto LAB_00130908;
    }
    break;
  case TWIN_MESSENGER_STATE_ERROR:
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar6 = handle->config->device_id;
      pcVar5 = "Device \'%s\' twin messenger failed to be started (messenger got into error state)";
      iVar3 = 0x430;
LAB_00130908:
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                 ,"amqp_device_do_work",iVar3,1,pcVar5,pcVar6);
    }
  }
LAB_0013090d:
  DVar4 = DEVICE_STATE_ERROR_MSG;
LAB_0013090f:
  update_state(handle,DVar4);
switchD_00130819_caseD_2:
  if (((handle->config->authentication_mode == DEVICE_AUTH_MODE_CBS) &&
      (handle->auth_state != AUTHENTICATION_STATE_STOPPED)) &&
     (handle->auth_state != AUTHENTICATION_STATE_ERROR)) {
    authentication_do_work(handle->authentication_handle);
  }
  if (1 < handle->msgr_state - TELEMETRY_MESSENGER_STATE_STOPPED) {
    telemetry_messenger_do_work(handle->messenger_handle);
  }
  if (1 < handle->twin_msgr_state - TWIN_MESSENGER_STATE_STOPPED) {
    twin_messenger_do_work(handle->twin_messenger_handle);
  }
  return;
}

Assistant:

void amqp_device_do_work(AMQP_DEVICE_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("Failed to perform amqp_device_do_work (handle is NULL)");
    }
    else
    {
        // Cranking the state monster:
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)handle;

        if (instance->state == DEVICE_STATE_STOPPING)
        {
            tickcounter_ms_t current_time_ms;

            if (tickcounter_get_current_ms(instance->tick_counter_handle, &current_time_ms) != 0)
            {
                LogError("Failed stopping device '%s' (could not get tickcounter time)", instance->config->device_id);
                update_state(instance, DEVICE_STATE_ERROR_MSG);
            }
            else if ((current_time_ms - instance->last_stop_request_time) > instance->stop_delay_ms)
            {
                if (internal_device_stop(instance) != 0)
                {
                    LogError("Failed stopping device '%s'", instance->config->device_id);
                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
            }
        }
        else if (instance->state == DEVICE_STATE_STARTING)
        {
            if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS)
            {
                if (instance->auth_state == AUTHENTICATION_STATE_STOPPED)
                {
                    if (authentication_start(instance->authentication_handle, instance->cbs_handle) != RESULT_OK)
                    {
                        LogError("Device '%s' failed to be authenticated (authentication_start failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                }
                else if (instance->auth_state == AUTHENTICATION_STATE_STARTING)
                {
                    int is_timed_out;
                    if (is_timeout_reached(instance->auth_state_last_changed_time, instance->auth_state_change_timeout_secs, &is_timed_out) != RESULT_OK)
                    {
                        LogError("Device '%s' failed verifying the timeout for authentication start (is_timeout_reached failed)", instance->config->device_id);
                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                    else if (is_timed_out == 1)
                    {
                        LogError("Device '%s' authentication did not complete starting within expected timeout (%lu)", instance->config->device_id, (unsigned long)instance->auth_state_change_timeout_secs);

                        update_state(instance, DEVICE_STATE_ERROR_AUTH_TIMEOUT);
                    }
                }
                else if (instance->auth_state == AUTHENTICATION_STATE_ERROR)
                {
                    if (instance->auth_error_code == AUTHENTICATION_ERROR_AUTH_FAILED)
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                    else // DEVICE_STATE_ERROR_TIMEOUT
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH_TIMEOUT);
                    }
                }
                // There is no AUTHENTICATION_STATE_STOPPING
            }

            if (instance->config->authentication_mode == DEVICE_AUTH_MODE_X509 || instance->auth_state == AUTHENTICATION_STATE_STARTED)
            {
                size_t number_of_messengers_started = 0;

                if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_STOPPED)
                {
                    if (telemetry_messenger_start(instance->messenger_handle, instance->session_handle) != RESULT_OK)
                    {
                        LogError("Device '%s' messenger failed to be started (messenger_start failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_STARTING)
                {
                    int is_timed_out;
                    if (is_timeout_reached(instance->msgr_state_last_changed_time, instance->msgr_state_change_timeout_secs, &is_timed_out) != RESULT_OK)
                    {
                        LogError("Device '%s' failed verifying the timeout for messenger start (is_timeout_reached failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                    else if (is_timed_out == 1)
                    {
                        LogError("Device '%s' messenger did not complete starting within expected timeout (%lu)", instance->config->device_id, (unsigned long)instance->msgr_state_change_timeout_secs);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_ERROR)
                {
                    LogError("Device '%s' messenger failed to be started (messenger got into error state)", instance->config->device_id);

                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
                else if (instance->msgr_state == TELEMETRY_MESSENGER_STATE_STARTED)
                {
                    number_of_messengers_started++;
                }

                if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_STOPPED)
                {
                    if (twin_messenger_start(instance->twin_messenger_handle, instance->session_handle) != RESULT_OK)
                    {
                        LogError("Device '%s' twin messenger failed to be started (messenger_start failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_STARTING)
                {
                    int is_timed_out;
                    if (is_timeout_reached(instance->twin_msgr_state_last_changed_time, instance->twin_msgr_state_change_timeout_secs, &is_timed_out) != RESULT_OK)
                    {
                        LogError("Device '%s' failed verifying the timeout for twin messenger start (is_timeout_reached failed)", instance->config->device_id);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                    else if (is_timed_out == 1)
                    {
                        LogError("Device '%s' twin messenger did not complete starting within expected timeout (%lu)", instance->config->device_id, (unsigned long)instance->twin_msgr_state_change_timeout_secs);

                        update_state(instance, DEVICE_STATE_ERROR_MSG);
                    }
                }
                else if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_ERROR)
                {
                    LogError("Device '%s' twin messenger failed to be started (messenger got into error state)", instance->config->device_id);

                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
                else if (instance->twin_msgr_state == TWIN_MESSENGER_STATE_STARTED)
                {
                    number_of_messengers_started++;
                }

                if (number_of_messengers_started == 2)
                {
                    update_state(instance, DEVICE_STATE_STARTED);
                }
            }
        }
        else if (instance->state == DEVICE_STATE_STARTED)
        {
            if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS &&
                instance->auth_state != AUTHENTICATION_STATE_STARTED)
            {
                LogError("Device '%s' is started but authentication reported unexpected state %d", instance->config->device_id, instance->auth_state);

                if (instance->auth_state != AUTHENTICATION_STATE_ERROR)
                {
                    if (instance->auth_error_code == AUTHENTICATION_ERROR_AUTH_FAILED)
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH);
                    }
                    else // AUTHENTICATION_ERROR_AUTH_TIMEOUT
                    {
                        update_state(instance, DEVICE_STATE_ERROR_AUTH_TIMEOUT);
                    }
                }
                else
                {
                    update_state(instance, DEVICE_STATE_ERROR_AUTH);
                }
            }
            else
            {
                if (instance->msgr_state != TELEMETRY_MESSENGER_STATE_STARTED)
                {
                    LogError("Device '%s' is started but messenger reported unexpected state %d", instance->config->device_id, instance->msgr_state);
                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }

                if (instance->twin_msgr_state != TWIN_MESSENGER_STATE_STARTED)
                {
                    LogError("Device '%s' is started but TWIN messenger reported unexpected state %d", instance->config->device_id, instance->twin_msgr_state);
                    update_state(instance, DEVICE_STATE_ERROR_MSG);
                }
            }
        }

        // Invoking the do_works():
        if (instance->config->authentication_mode == DEVICE_AUTH_MODE_CBS)
        {
            if (instance->auth_state != AUTHENTICATION_STATE_STOPPED && instance->auth_state != AUTHENTICATION_STATE_ERROR)
            {
                authentication_do_work(instance->authentication_handle);
            }
        }

        if (instance->msgr_state != TELEMETRY_MESSENGER_STATE_STOPPED && instance->msgr_state != TELEMETRY_MESSENGER_STATE_ERROR)
        {
            telemetry_messenger_do_work(instance->messenger_handle);
        }

        if (instance->twin_msgr_state != TWIN_MESSENGER_STATE_STOPPED && instance->twin_msgr_state != TWIN_MESSENGER_STATE_ERROR)
        {
            twin_messenger_do_work(instance->twin_messenger_handle);
        }
    }
}